

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::EndTabItem(void)

{
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabBar *pIVar2;
  
  if ((GImGui->CurrentWindow->SkipItems == false) &&
     (pIVar2 = (GImGui->CurrentTabBar).Data[(long)(GImGui->CurrentTabBar).Size + -1],
     ((pIVar2->Tabs).Data[pIVar2->LastTabItemIdx].Flags & 8) == 0)) {
    pIVar1 = &GImGui->CurrentWindow->IDStack;
    pIVar1->Size = pIVar1->Size + -1;
  }
  return;
}

Assistant:

void    ImGui::EndTabItem()
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return;

    IM_ASSERT(g.CurrentTabBar.Size > 0 && "Needs to be called between BeginTabBar() and EndTabBar()!");
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    IM_ASSERT(tab_bar->LastTabItemIdx >= 0 && "Needs to be called between BeginTabItem() and EndTabItem()");
    ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
    if (!(tab->Flags & ImGuiTabItemFlags_NoPushId))
        g.CurrentWindow->IDStack.pop_back();
}